

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

wchar_t curses_display_objects
                  (nh_objitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  nh_objresult_conflict *results)

{
  char *pcVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  wchar_t wVar6;
  gamewin *gw;
  WINDOW *pWVar7;
  long lVar8;
  _func_void_gamewin_ptr *p_Var9;
  nh_menuitem_conflict *items_00;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  char cVar13;
  bool bVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  wchar_t *pwVar20;
  size_t __nmemb;
  ulong uVar21;
  bool bVar22;
  wchar_t ccount;
  long local_200;
  size_t local_1f8;
  undefined4 local_1f0;
  wchar_t selected [1];
  nh_cmd_arg local_1e0;
  long local_1d8;
  char *local_1d0;
  long local_1c8;
  nh_objresult_conflict *local_1c0;
  char title_1 [128];
  char sbuf [256];
  
  local_1c0 = results;
  local_1f0 = curs_set(0);
  gw = alloc_gamewin(L'H');
  gw->draw = draw_objmenu;
  gw->resize = resize_objmenu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
  __nmemb = (size_t)icount;
  pWVar7 = (WINDOW *)calloc(__nmemb,4);
  gw[1].win = pWVar7;
  if ((uint)(how + L'\xffffffff') < 0xfffffffe) {
    lVar8 = 0;
    sVar11 = 0;
    if (0 < (long)__nmemb) {
      sVar11 = __nmemb;
    }
    cVar13 = 'a';
    for (; sVar11 * 0x124 - lVar8 != 0; lVar8 = lVar8 + 0x124) {
      if ((((&items->accel)[lVar8] == '\0') && (*(int *)((long)&items->role + lVar8) == 1)) &&
         (*(int *)((long)&items->id + lVar8) != 0)) {
        (&items->accel)[lVar8] = cVar13;
        if (cVar13 == 'z') {
          cVar13 = 'A';
        }
        else if (cVar13 == 'Z') {
          cVar13 = 'a';
        }
        else {
          cVar13 = cVar13 + '\x01';
        }
      }
    }
  }
  local_1f8 = __nmemb;
  layout_objmenu(gw);
  iVar5 = *(int *)((long)&gw[2].win + 4);
  pWVar7 = (WINDOW *)
           newwin(*(int *)&gw[2].resize,iVar5,
                  (long)(_LINES - *(int *)&gw[2].resize) / 2 & 0xffffffff,
                  (long)(_COLS - iVar5) / 2 & 0xffffffff);
  gw->win = pWVar7;
  keypad(pWVar7,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var9 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)&gw[2].win,*(undefined4 *)&gw[2].next,
                  *(int *)((long)&gw[2].resize + 4) + -1,2);
  gw[1].draw = p_Var9;
  leaveok(gw->win,1);
  leaveok(gw[1].draw,1);
  if (icount < L'\x01') {
    icount = L'\0';
  }
  uVar21 = (ulong)(uint)icount;
LAB_0010d2da:
  bVar14 = true;
  uVar18 = 0;
LAB_0010d2dc:
  wVar6 = L'\xffffffff';
  if ((char)uVar18 != '\0') {
    delwin(gw[1].draw);
    delwin(gw->win);
    if (bVar14) {
      pwVar20 = &items->id;
      wVar6 = L'\0';
      for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
        pWVar7 = gw[1].win;
        if ((pWVar7->_bkgrnd).chars[uVar12 - 0x17] != L'\0') {
          if (local_1c0 != (nh_objresult_conflict *)0x0) {
            local_1c0[wVar6].id = *pwVar20;
            local_1c0[wVar6].count = (pWVar7->_bkgrnd).chars[uVar12 - 0x17];
          }
          wVar6 = wVar6 + L'\x01';
        }
        pwVar20 = pwVar20 + 0x49;
      }
    }
    free(gw[1].win);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(local_1f0);
    return wVar6;
  }
  draw_objmenu(gw);
  wVar2 = nh_wgetch(gw->win);
  switch(wVar2) {
  case L':':
    curses_getline("Search:",sbuf);
    lVar8 = 0;
    for (uVar12 = 0; bVar14 = true, uVar21 != uVar12; uVar12 = uVar12 + 1) {
      pcVar15 = strstr((char *)(gw[1].resize + lVar8),sbuf);
      if (pcVar15 != (char *)0x0) {
        iVar5 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
        uVar18 = 0;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if ((int)uVar12 < iVar5) {
          iVar5 = (int)uVar12;
        }
        *(int *)&gw[2].draw = iVar5;
        goto LAB_0010d2dc;
      }
      lVar8 = lVar8 + 0x124;
    }
    goto LAB_0010d86f;
  case L';':
  case L'=':
  case L'?':
switchD_0010d44c_caseD_104:
    if (9 < (uint)(wVar2 + L'\xffffffd0')) {
      uVar4 = *(uint *)&gw[1].prev;
      uVar12 = (ulong)*(int *)&gw[2].draw;
      uVar18 = *(int *)&gw[2].draw + *(int *)&gw[2].win;
      if ((int)uVar4 < (int)uVar18) {
        uVar18 = uVar4;
      }
      lVar8 = uVar12 * 0x124 + 0x120;
      for (; (long)uVar12 < (long)(int)uVar18; uVar12 = uVar12 + 1) {
        p_Var9 = gw[1].resize;
        if (wVar2 == (char)p_Var9[lVar8]) goto LAB_0010d5cc;
        lVar8 = lVar8 + 0x124;
      }
      if (*(int *)&gw[2].win < (int)uVar4) {
        uVar16 = 0;
        if (0 < (int)uVar4) {
          uVar16 = (ulong)uVar4;
        }
        lVar8 = 0x120;
        for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          p_Var9 = gw[1].resize;
          if (wVar2 == (char)p_Var9[lVar8]) goto LAB_0010d5cc;
          lVar8 = lVar8 + 0x124;
        }
      }
      goto LAB_0010d5d5;
    }
    iVar5 = *(int *)((long)&gw[2].draw + 4);
    iVar3 = iVar5 * 10;
    uVar18 = 0;
    if (iVar5 == -1) {
      iVar3 = 0;
    }
    uVar4 = iVar3 + wVar2 + L'\xffffffd0';
    *(uint *)((long)&gw[2].draw + 4) = uVar4;
    bVar14 = true;
    if (0xffff < (int)uVar4) {
      uVar18 = 0;
      *(uint *)((long)&gw[2].draw + 4) = uVar4 / 10;
    }
    goto LAB_0010d2dc;
  case L'<':
switchD_0010d3ee_caseD_3c:
    iVar5 = *(int *)&gw[2].draw;
LAB_0010d4a7:
    iVar5 = iVar5 - *(int *)&gw[2].win;
    uVar18 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    *(int *)&gw[2].draw = iVar5;
    bVar14 = true;
    goto LAB_0010d2dc;
  case L'>':
switchD_0010d3ee_caseD_3e:
    iVar5 = *(int *)&gw[2].draw;
    iVar10 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
    iVar3 = *(int *)&gw[2].win + iVar5;
    if (iVar10 <= iVar3) {
      iVar3 = iVar10;
    }
    *(int *)&gw[2].draw = iVar3;
    bVar14 = true;
    uVar18 = 0;
    if (wVar2 == L' ') {
      uVar18 = (uint)(iVar5 == iVar3);
    }
    goto LAB_0010d2dc;
  case L'@':
    bVar14 = true;
    uVar18 = 0;
    if (*(int *)((long)&gw[1].prev + 4) != 2) goto LAB_0010d2dc;
    lVar8 = 0x110;
    for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
      if (*(int *)(gw[1].resize + lVar8) != -1) {
        ((gw[1].win)->_bkgrnd).chars[uVar12 - 0x17] =
             -(uint)(((gw[1].win)->_bkgrnd).chars[uVar12 - 0x17] == L'\0');
      }
      lVar8 = lVar8 + 0x124;
    }
    goto LAB_0010d2da;
  }
  switch(wVar2) {
  case L'Ă':
    bVar14 = true;
    uVar18 = 0;
    if (*(int *)&gw[1].prev - *(int *)&gw[2].win <= *(int *)&gw[2].draw) goto LAB_0010d2dc;
    iVar5 = *(int *)&gw[2].draw + 1;
    break;
  case L'ă':
    bVar14 = true;
    uVar18 = 0;
    if (*(int *)&gw[2].draw < 1) goto LAB_0010d2dc;
    iVar5 = *(int *)&gw[2].draw + -1;
    break;
  case L'Ą':
  case L'ą':
    goto switchD_0010d44c_caseD_104;
  case L'Ć':
switchD_0010d44c_caseD_106:
    *(undefined4 *)&gw[2].draw = 0;
    goto LAB_0010d2da;
  case L'ć':
switchD_0010d44c_caseD_107:
    iVar5 = *(int *)((long)&gw[2].draw + 4);
    wVar2 = iVar5 / 10;
    if (iVar5 + 9U < 0x13) {
      wVar2 = wVar6;
    }
    *(wchar_t *)((long)&gw[2].draw + 4) = wVar2;
    goto LAB_0010d2da;
  default:
    if (wVar2 == L'\r') {
LAB_0010d4be:
      bVar14 = true;
      uVar18 = 1;
      goto LAB_0010d2dc;
    }
    uVar18 = 1;
    bVar14 = false;
    if (wVar2 == L'\x1b') goto LAB_0010d2dc;
    if (wVar2 == L' ') goto switchD_0010d3ee_caseD_3e;
    if (wVar2 == L',') {
      bVar14 = true;
      uVar18 = 0;
      if (*(int *)((long)&gw[1].prev + 4) != 2) goto LAB_0010d2dc;
      lVar8 = (long)*(int *)&gw[2].draw;
      lVar19 = lVar8 * 0x49 + 0x44;
      for (; (lVar8 < (long)local_1f8 &&
             (lVar8 < (long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw)); lVar8 = lVar8 + 1) {
        if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
          ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] = L'\xffffffff';
        }
        lVar19 = lVar19 + 0x49;
      }
    }
    else {
      if (wVar2 == L'Ũ') {
LAB_0010d4a3:
        iVar5 = *(int *)&gw[1].prev;
        goto LAB_0010d4a7;
      }
      if (wVar2 == L'.') goto LAB_0010d51d;
      if (wVar2 == L'\\') {
        lVar8 = (long)*(int *)&gw[2].draw;
        lVar19 = lVar8 * 0x49 + 0x44;
        for (; (lVar8 < (long)local_1f8 &&
               (lVar8 < (long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw)); lVar8 = lVar8 + 1) {
          if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
            ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] = L'\0';
          }
          lVar19 = lVar19 + 0x49;
        }
      }
      else {
        if (wVar2 == L'^') goto switchD_0010d44c_caseD_106;
        if (wVar2 == L'|') goto LAB_0010d4a3;
        if (wVar2 == L'~') {
          bVar14 = true;
          uVar18 = 0;
          if (*(int *)((long)&gw[1].prev + 4) != 2) goto LAB_0010d2dc;
          lVar8 = (long)*(int *)&gw[2].draw;
          lVar19 = lVar8 * 0x49 + 0x44;
          for (; (lVar8 < (long)local_1f8 &&
                 (lVar8 < (long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw)); lVar8 = lVar8 + 1)
          {
            if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
              ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] =
                   -(uint)(((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] == L'\0');
            }
            lVar19 = lVar19 + 0x49;
          }
        }
        else {
          if (wVar2 == L'\x7f') goto switchD_0010d44c_caseD_107;
          if (wVar2 == L'Œ') goto switchD_0010d3ee_caseD_3e;
          if (wVar2 == L'œ') goto switchD_0010d3ee_caseD_3c;
          if (wVar2 == L'ŗ') goto LAB_0010d4be;
          if (wVar2 != L'-') goto switchD_0010d44c_caseD_104;
          for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
            ((gw[1].win)->_bkgrnd).chars[uVar12 - 0x17] = L'\0';
          }
        }
      }
    }
    goto LAB_0010d2da;
  }
  *(int *)&gw[2].draw = iVar5;
  goto LAB_0010d2da;
LAB_0010d51d:
  bVar14 = true;
  uVar18 = 0;
  if (*(int *)((long)&gw[1].prev + 4) == 2) goto LAB_0010d9e3;
  goto LAB_0010d2dc;
LAB_0010d9e3:
  lVar8 = 0x110;
  for (uVar12 = 0; uVar21 != uVar12; uVar12 = uVar12 + 1) {
    if (*(int *)(gw[1].resize + lVar8) != -1) {
      ((gw[1].win)->_bkgrnd).chars[uVar12 - 0x17] = L'\xffffffff';
    }
    lVar8 = lVar8 + 0x124;
  }
  goto LAB_0010d2da;
LAB_0010d5cc:
  if ((int)uVar12 == -1) {
LAB_0010d5d5:
    bVar14 = true;
    uVar18 = 0;
    if (*(int *)((long)&gw[1].prev + 4) == 2) {
      lVar8 = 0;
      for (lVar19 = 0; lVar19 < (int)uVar4; lVar19 = lVar19 + 1) {
        if ((wVar2 == (&items->group_accel)[lVar8]) &&
           (p_Var9 = gw[1].resize, *(int *)(p_Var9 + lVar8 + 0x110) != -1)) {
          wVar6 = *(wchar_t *)((long)&gw[2].draw + 4);
          pWVar7 = gw[1].win;
          if (wVar6 < L'\x01') {
            wVar6 = -(uint)((pWVar7->_bkgrnd).chars[lVar19 + -0x17] == L'\0');
          }
          (pWVar7->_bkgrnd).chars[lVar19 + -0x17] = wVar6;
          if (*(wchar_t *)(p_Var9 + lVar8 + 0x108) <= wVar6) {
            (pWVar7->_bkgrnd).chars[lVar19 + -0x17] = L'\xffffffff';
          }
          uVar18 = uVar18 + 1;
          uVar4 = *(uint *)&gw[1].prev;
        }
        lVar8 = lVar8 + 0x124;
      }
      bVar22 = uVar18 != 0;
      uVar18 = 0;
      if (bVar22) {
        *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
        goto LAB_0010d2da;
      }
    }
    goto LAB_0010d2dc;
  }
  iVar5 = *(int *)((long)&gw[2].draw + 4);
  lVar8 = (long)(uVar12 << 0x20) >> 0x1e;
  pWVar7 = gw[1].win;
  if (iVar5 < 1) {
    iVar5 = -(uint)(*(int *)((long)(pWVar7->_bkgrnd).chars + lVar8 + -0x5c) == 0);
  }
  *(int *)((long)(pWVar7->_bkgrnd).chars + lVar8 + -0x5c) = iVar5;
  lVar19 = (long)(uVar12 << 0x20) >> 0x20;
  lVar17 = lVar19 * 0x124;
  if (*(int *)(p_Var9 + lVar17 + 0x108) <= *(int *)((long)(pWVar7->_bkgrnd).chars + lVar8 + -0x5c))
  {
    (pWVar7->_bkgrnd).chars[lVar19 + -0x17] = L'\xffffffff';
  }
  *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
  iVar5 = *(int *)((long)&gw[1].prev + 4);
  bVar14 = true;
  uVar18 = 1;
  if (iVar5 == 1) goto LAB_0010d2dc;
  if (iVar5 != -1) goto LAB_0010d2da;
  ccount = L'\0';
  local_200 = lVar17;
  lVar8 = nh_get_object_commands(&ccount,(int)(char)p_Var9[lVar17 + 0x120]);
  wVar6 = ccount;
  if (ccount != L'\0' && lVar8 != 0) {
    p_Var9 = p_Var9 + local_200;
    items_00 = (nh_menuitem_conflict *)malloc((long)ccount * 0x10c);
    uVar12 = 0;
    if (L'\0' < wVar6) {
      uVar12 = (ulong)(uint)wVar6;
    }
    pcVar15 = (char *)(lVar8 + 100);
    local_1d0 = items_00->caption;
    local_1c8 = uVar12 * 0x10c;
    iVar5 = 1;
    local_1d8 = lVar8;
    for (lVar19 = 0; local_1c8 != lVar19; lVar19 = lVar19 + 0x10c) {
      *(int *)(items_00->caption + lVar19 + -8) = iVar5;
      pcVar1 = items_00->caption + lVar19 + -4;
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      local_200 = CONCAT44(local_200._4_4_,iVar5);
      (&items_00->accel)[lVar19] = *pcVar15;
      *(undefined2 *)(&items_00->group_accel + lVar19) = 0;
      strcpy(local_1d0 + lVar19,pcVar15 + -0x50);
      pcVar15 = pcVar15 + 0x6c;
      iVar5 = (int)local_200 + 1;
    }
    if ((settings.invweight == '\0') || (*(int *)(p_Var9 + 0x118) == -1)) {
      snprintf(title_1,0x80,"%c - %s",(ulong)(uint)(int)(char)p_Var9[0x120],p_Var9);
    }
    else {
      snprintf(title_1,0x80,"%c - %s {%d}",(ulong)(uint)(int)(char)p_Var9[0x120],p_Var9);
    }
    wVar6 = curses_display_menu(items_00,ccount,title_1,L'\x01',selected);
    free(items_00);
    if (L'\0' < wVar6) {
      cVar13 = *(char *)(local_1d8 + -7 + (long)selected[0] * 0x6c);
      local_1e0.argtype = 2;
      if (cVar13 != '\0') {
        local_1e0.argtype = 0x10;
        local_1e0.field_1.invlet = cVar13;
      }
      set_next_command((char *)(local_1d8 + (long)selected[0] * 0x6c + -0x6c),&local_1e0);
      bVar14 = true;
      uVar18 = 1;
      goto LAB_0010d2dc;
    }
  }
LAB_0010d86f:
  bVar14 = true;
  uVar18 = 0;
  goto LAB_0010d2dc;
}

Assistant:

int curses_display_objects(struct nh_objitem *items, int icount,
		  const char *title, int how, struct nh_objresult *results)
{
    struct gamewin *gw;
    struct win_objmenu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_objmenu));
    gw->draw = draw_objmenu;
    gw->resize = resize_objmenu;
    mdat = (struct win_objmenu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selcount = -1;
    mdat->selected = calloc(icount, sizeof(int));
    
    if (how != PICK_NONE && how != PICK_INVACTION)
	assign_objmenu_accelerators(mdat);
    layout_objmenu(gw);
    
    starty = (LINES - mdat->height) / 2;
    startx = (COLS - mdat->width) / 2;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_objmenu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && prev_offset == mdat->offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = -1;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = 0;
		break;
		
	    /* invert all */
	    case '@':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* select page */
	    case ',':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = -1;
		break;
		
	    /* deselect page */
	    case '\\':
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = 0;
		break;
		
	    /* invert page */
	    case '~':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* edit selection count */
	    case KEY_BACKSPACE:
	    case KEY_BACKDEL:
		mdat->selcount /= 10;
		if (mdat->selcount == 0)
		    mdat->selcount = -1; /* -1: select all */
		break;
		
	    default:
		/* selection allows an item count */
		if (key >= '0' && key <= '9') {
		    if (mdat->selcount == -1)
			mdat->selcount = 0;
		    mdat->selcount = mdat->selcount * 10 + (key - '0');
		    if (mdat->selcount > 0xffff)
			mdat->selcount /= 10;
		    
		    break;
		}
		
		/* try to find an item for this key and, if one is found, select it */
		idx = find_objaccel(key, mdat);
		
		if (idx != -1) { /* valid item accelerator */
		    if (mdat->selcount > 0)
			mdat->selected[idx] = mdat->selcount;
		    else
			mdat->selected[idx] = mdat->selected[idx] ? 0 : -1;
		    if (mdat->selected[idx] >= mdat->items[idx].count)
			mdat->selected[idx] = -1;
		    mdat->selcount = -1;
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		    
		    /* show item actions menu */
		    else if (mdat->how == PICK_INVACTION)
			if (do_item_actions(&mdat->items[idx]))
			    done = TRUE;
		    
		} else if (mdat->how == PICK_ANY) { /* maybe it's a group accel? */
		    int grouphits = 0;
		    for (i = 0; i < mdat->icount; i++) {
			if (items[i].group_accel == key && mdat->items[i].oclass != -1) {
			    if (mdat->selcount > 0)
				mdat->selected[i] = mdat->selcount;
			    else
				mdat->selected[i] = mdat->selected[i] ? 0 : -1;
			    if (mdat->selected[i] >= mdat->items[i].count)
				mdat->selected[i] = -1;
			    grouphits++;
			}
		    }
		    
		    if (grouphits)
			mdat->selcount = -1;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results) {
		    results[rv].id = items[i].id;
		    results[rv].count = mdat->selected[i];
		}
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}